

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::
         write_significand<fmt::v9::appender,char,char_const*,fmt::v9::detail::digit_grouping<char>>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  appender aVar1;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  undefined **local_240;
  undefined1 *local_238;
  long local_230;
  size_t local_228;
  undefined1 local_220 [504];
  
  if ((grouping->sep_).thousands_sep == '\0') {
    aVar1 = write_significand<fmt::v9::appender,char>
                      (out,significand,significand_size,integral_size,decimal_point);
    return (appender)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  local_230 = 0;
  local_240 = &PTR_grow_002d06b8;
  local_228 = 500;
  local_238 = local_220;
  write_significand<fmt::v9::appender,char>
            ((appender)&local_240,significand,significand_size,integral_size,decimal_point);
  if (-1 < integral_size) {
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_238;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v9::appender,char>(grouping,out,digits);
    aVar1 = copy_str_noinline<char,char*,fmt::v9::appender>
                      (local_238 + (uint)integral_size,local_238 + local_230,out);
    if (local_238 != local_220) {
      operator_delete(local_238,local_228);
    }
    return (appender)
           aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/fmt-src/include/fmt/core.h"
              ,0x199,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}